

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

int __thiscall smf::MidiMessage::getKeyNumber(MidiMessage *this)

{
  bool bVar1;
  int output;
  MidiMessage *this_local;
  
  bVar1 = isNote(this);
  if ((bVar1) || (bVar1 = isAftertouch(this), bVar1)) {
    this_local._4_4_ = getP1(this);
    if (-1 < (int)this_local._4_4_) {
      this_local._4_4_ = this_local._4_4_ & 0xff;
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int MidiMessage::getKeyNumber(void) const {
	if (isNote() || isAftertouch()) {
		int output = getP1();
		if (output < 0) {
			return output;
		} else {
			return 0xff & output;
		}
	} else {
		return -1;
	}
}